

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::BamWriterPrivate::Close(BamWriterPrivate *this)

{
  bool bVar1;
  
  bVar1 = BgzfStream::IsOpen(&this->m_stream);
  if (bVar1) {
    BgzfStream::Close(&this->m_stream);
  }
  return;
}

Assistant:

void BamWriterPrivate::Close()
{

    // skip if file not open
    if (!IsOpen()) {
        return;
    }

    // close output stream
    try {
        m_stream.Close();
    } catch (const BamException& e) {
        m_errorString = e.what();
    }
}